

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               MessageLite *prototype,LazyEagerVerifyFnType verify_func,LazyAnnotation is_lazy)

{
  undefined4 in_register_00000034;
  ExtensionSet local_40;
  TcParseTableBase *local_28;
  undefined8 local_20;
  LazyEagerVerifyFnType local_18;
  
  if ((type & 0xfe) == 10) {
    local_40._15_1_ = is_lazy;
    local_20 = 0;
    local_18 = verify_func;
    local_40.arena_ = (Arena *)extendee;
    local_40._8_4_ = number;
    local_40._12_1_ = type;
    local_40._13_1_ = is_repeated;
    local_40._14_1_ = is_packed;
    local_28 = MessageLite::GetTcParseTable(prototype);
    local_40.map_ = (AllocatedData)prototype;
    anon_unknown_59::Register
              ((anon_unknown_59 *)&local_40,(ExtensionInfo *)CONCAT44(in_register_00000034,number));
    return;
  }
  RegisterMessageExtension(&local_40);
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* extendee,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype,
                                            LazyEagerVerifyFnType verify_func,
                                            LazyAnnotation is_lazy) {
  ABSL_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
             type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed,
                     verify_func, is_lazy);
  info.message_info = {prototype,
#if defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
                       prototype->GetTcParseTable()
#else
                       nullptr
#endif
  }